

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O2

void __thiscall neural_networks::utilities::Matrix<long_double>::print(Matrix<long_double> *this)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  std::operator<<((ostream *)&std::cout,"\n");
  for (uVar4 = 0; uVar4 < this->N; uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&std::cout,"[ ");
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < this->M; uVar2 = uVar2 + 1) {
      poVar1 = std::ostream::_M_insert<long_double>
                         (*(longdouble *)
                           (*(long *)&(this->matrix).
                                      super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                      super__Vector_base<long_double,_std::allocator<long_double>_>.
                                      _M_impl.super__Vector_impl_data + lVar3));
      std::operator<<(poVar1," ");
      lVar3 = lVar3 + 0x10;
    }
    std::operator<<((ostream *)&std::cout,"]\n");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void neural_networks::utilities::Matrix<T>::print() const {
    std::cout << "\n";
    size_t i, j;
    for(i = 0; i < N; ++i) {
        std::cout << "[ ";
        for(j = 0; j < M; ++j) {
            std::cout << matrix[i][j] << " ";
        }
        std::cout << "]\n";
    }
    std::cout << std::endl;
}